

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HTMLOutput.cpp
# Opt level: O1

void __thiscall Test::HTMLOutput::generateHeader(HTMLOutput *this,ostream *stream,string *title)

{
  ostream *poVar1;
  
  std::__ostream_insert<char,std::char_traits<char>>(stream,"<!DOCTYPE html>",0xf);
  std::ios::widen((char)*(undefined8 *)(*(long *)stream + -0x18) + (char)stream);
  std::ostream::put((char)stream);
  poVar1 = (ostream *)std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"<html><head><title>",0x13);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar1,(title->_M_dataplus)._M_p,title->_M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"</title>",8);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
  std::ostream::put((char)poVar1);
  poVar1 = (ostream *)std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar1,"<meta http-equiv=\"content-type\" content=\"text/html; charset=utf-8\" />",0x45
            );
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
  std::ostream::put((char)poVar1);
  poVar1 = (ostream *)std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar1,
             "<meta name=\"generator\" content=\"CppTest-lite - http://github.com/doe300/cpptest-lite\" />"
             ,0x58);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
  std::ostream::put((char)poVar1);
  poVar1 = (ostream *)std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"<style type=\"text/css\">",0x17);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
  std::ostream::put((char)poVar1);
  poVar1 = (ostream *)std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"td { vertical-align: super}",0x1b);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
  std::ostream::put((char)poVar1);
  poVar1 = (ostream *)std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,".message { display: block}",0x1a);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
  std::ostream::put((char)poVar1);
  poVar1 = (ostream *)std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar1,"table { border: 1px solid grey; border-spacing: 0px}",0x34);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
  std::ostream::put((char)poVar1);
  poVar1 = (ostream *)std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar1,"td {border-top: 1px solid grey; padding: 2px}",0x2d);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
  std::ostream::put((char)poVar1);
  poVar1 = (ostream *)std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar1,"td:not(:last-child), th:not(:last-child) {border-right: 1px solid grey}",0x47);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
  std::ostream::put((char)poVar1);
  poVar1 = (ostream *)std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar1,".allPassed { background-color: green}",0x25);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
  std::ostream::put((char)poVar1);
  poVar1 = (ostream *)std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar1,".mostPassed { background-color: yellow}",0x27);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
  std::ostream::put((char)poVar1);
  poVar1 = (ostream *)std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar1,".manyPassed { background-color: orange}",0x27);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
  std::ostream::put((char)poVar1);
  poVar1 = (ostream *)std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar1,".somePassed { background-color: orangered}",0x2a);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
  std::ostream::put((char)poVar1);
  poVar1 = (ostream *)std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar1,".fewPassed {background-color: red}",0x22);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
  std::ostream::put((char)poVar1);
  poVar1 = (ostream *)std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"</style>",8);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
  std::ostream::put((char)poVar1);
  poVar1 = (ostream *)std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"</head>",7);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
  std::ostream::put((char)poVar1);
  std::ostream::flush();
  return;
}

Assistant:

void HTMLOutput::generateHeader(std::ostream &stream, const std::string &title) {
  stream << "<!DOCTYPE html>" << std::endl
         << "<html><head><title>" << title << "</title>" << std::endl
         << R"(<meta http-equiv="content-type" content="text/html; charset=utf-8" />)" << std::endl
         << R"(<meta name="generator" content="CppTest-lite - http://github.com/doe300/cpptest-lite" />)" << std::endl
         << R"(<style type="text/css">)" << std::endl
         << "td { vertical-align: super}" << std::endl
         << ".message { display: block}" << std::endl
         << "table { border: 1px solid grey; border-spacing: 0px}" << std::endl
         << "td {border-top: 1px solid grey; padding: 2px}" << std::endl
         << "td:not(:last-child), th:not(:last-child) {border-right: 1px solid grey}" << std::endl
         << ".allPassed { background-color: green}" << std::endl
         << ".mostPassed { background-color: yellow}" << std::endl
         << ".manyPassed { background-color: orange}" << std::endl
         << ".somePassed { background-color: orangered}" << std::endl
         << ".fewPassed {background-color: red}" << std::endl
         << "</style>" << std::endl
         << "</head>" << std::endl;
}